

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortRangeInteraction.cpp
# Opt level: O2

void __thiscall OpenMD::ShortRangeInteraction::ShortRangeInteraction(ShortRangeInteraction *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_ShortRangeInteraction = (_func_int **)&PTR__ShortRangeInteraction_002f34d8;
  (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->globalIndex_ = -1;
  this->localIndex_ = -1;
  (this->properties_)._vptr_PropertyMap = (_func_int **)&PTR__PropertyMap_002f0378;
  p_Var1 = &(this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ShortRangeInteraction::ShortRangeInteraction() :
      globalIndex_(-1), localIndex_(-1) {}